

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O0

enable_if_t<std::is_signed<int>::value>
absl::lts_20250127::log_internal::anon_unknown_3::PutLeadingWhitespace<int>(int tid,char **p)

{
  char *pcVar1;
  char **p_local;
  int tid_local;
  
  if ((-1 < tid) && (tid < 10)) {
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = ' ';
  }
  if ((-10 < tid) && (tid < 100)) {
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = ' ';
  }
  if ((-100 < tid) && (tid < 1000)) {
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = ' ';
  }
  if ((-1000 < tid) && (tid < 10000)) {
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = ' ';
  }
  if ((-10000 < tid) && (tid < 100000)) {
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = ' ';
  }
  if ((-100000 < tid) && (tid < 1000000)) {
    pcVar1 = *p;
    *p = pcVar1 + 1;
    *pcVar1 = ' ';
  }
  return;
}

Assistant:

inline std::enable_if_t<std::is_signed<T>::value>
PutLeadingWhitespace(T tid, char*& p) {
  if (tid >= 0 && tid < 10) *p++ = ' ';
  if (tid > -10 && tid < 100) *p++ = ' ';
  if (tid > -100 && tid < 1000) *p++ = ' ';
  if (tid > -1000 && tid < 10000) *p++ = ' ';
  if (tid > -10000 && tid < 100000) *p++ = ' ';
  if (tid > -100000 && tid < 1000000) *p++ = ' ';
}